

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

uint8_t __thiscall
libtorrent::aux::session_impl::use_quota_overhead
          (session_impl *this,peer_class_set *set,int amount_down,int amount_up)

{
  char cVar1;
  peer_class *this_00;
  byte bVar2;
  long lVar3;
  byte bVar4;
  
  cVar1 = set->m_size;
  if ((long)cVar1 < 1) {
    bVar2 = 0;
  }
  else {
    lVar3 = 0;
    bVar2 = 0;
    do {
      this_00 = peer_class_pool::at(&this->m_classes,
                                    (peer_class_t)
                                    (set->m_class).
                                    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                                    ._M_elems[lVar3].m_val);
      if (this_00 != (peer_class *)0x0) {
        bandwidth_channel::use_quota((bandwidth_channel *)&this_00->field_0x18,amount_down);
        bVar4 = bVar2 | 2;
        if (amount_down <= *(int *)&this_00->field_0x28) {
          bVar4 = bVar2;
        }
        if (*(int *)&this_00->field_0x28 < 1) {
          bVar4 = bVar2;
        }
        bandwidth_channel::use_quota((bandwidth_channel *)this_00,amount_up);
        bVar2 = (*(int *)&this_00->field_0x10 < amount_up && 0 < *(int *)&this_00->field_0x10) |
                bVar4;
      }
      lVar3 = lVar3 + 1;
    } while (cVar1 != lVar3);
  }
  return bVar2;
}

Assistant:

std::uint8_t session_impl::use_quota_overhead(peer_class_set& set, int const amount_down, int const amount_up)
	{
		std::uint8_t ret = 0;
		int const num = set.num_classes();
		for (int i = 0; i < num; ++i)
		{
			peer_class* p = m_classes.at(set.class_at(i));
			if (p == nullptr) continue;

			bandwidth_channel* ch = &p->channel[peer_connection::download_channel];
			if (use_quota_overhead(ch, amount_down))
				ret |= 1u << peer_connection::download_channel;
			ch = &p->channel[peer_connection::upload_channel];
			if (use_quota_overhead(ch, amount_up))
				ret |= 1u << peer_connection::upload_channel;
		}
		return ret;
	}